

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool __thiscall ON_NurbsCurve::IsPeriodic(ON_NurbsCurve *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  double *pointA;
  double *pointB;
  
  bVar1 = ON_IsKnotVectorPeriodic(this->m_order,this->m_cv_count,this->m_knot);
  if (bVar1) {
    iVar3 = this->m_order;
    if (1 < (long)iVar3) {
      pointB = this->m_cv + ((long)this->m_cv_count + -1) * (long)this->m_cv_stride;
      pointA = this->m_cv + ((long)iVar3 + -2) * (long)this->m_cv_stride;
      iVar3 = iVar3 + -1;
      do {
        bVar2 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,pointA,pointB);
        if (!bVar2) {
          return false;
        }
        pointA = pointA + -(long)this->m_cv_stride;
        pointB = pointB + -(long)this->m_cv_stride;
        iVar3 = iVar3 + -1;
      } while (0 < iVar3);
    }
  }
  return bVar1;
}

Assistant:

bool 
ON_NurbsCurve::IsPeriodic() const
{
  bool bIsPeriodic = ON_IsKnotVectorPeriodic( m_order, m_cv_count, m_knot );
  if ( bIsPeriodic ) {
    int i0 = m_order-2;
    int i1 = m_cv_count-1;
    const double* cv0 = m_cv + i0*m_cv_stride;
    const double* cv1 = m_cv + i1*m_cv_stride;
    for ( /*empty*/; i0 >= 0; i0--, i1-- ) {
      if ( false == ON_PointsAreCoincident( m_dim, m_is_rat, cv0, cv1 ) )
        return false;
      cv0 -= m_cv_stride;
      cv1 -= m_cv_stride;      
    }
  }
  return bIsPeriodic;
}